

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_result * __thiscall
pugi::xml_document::load_file(xml_document *this,char *path_,uint options,xml_encoding encoding)

{
  FILE *data_;
  xml_document *in_RDI;
  char_t **in_stack_00000018;
  xml_encoding in_stack_00000020;
  uint in_stack_00000024;
  FILE *in_stack_00000028;
  auto_deleter<_IO_FILE> file;
  char *in_stack_ffffffffffffffa8;
  auto_deleter<_IO_FILE> local_28 [2];
  
  reset(in_RDI);
  data_ = impl::anon_unknown_0::open_file((char *)in_RDI,in_stack_ffffffffffffffa8);
  impl::anon_unknown_0::auto_deleter<_IO_FILE>::auto_deleter
            (local_28,data_,impl::anon_unknown_0::close_file);
  impl::anon_unknown_0::load_file_impl
            ((xml_document_struct *)file.data,in_stack_00000028,in_stack_00000024,in_stack_00000020,
             in_stack_00000018);
  impl::anon_unknown_0::auto_deleter<_IO_FILE>::~auto_deleter((auto_deleter<_IO_FILE> *)in_RDI);
  return (xml_parse_result *)in_RDI;
}

Assistant:

PUGI_IMPL_FN xml_parse_result xml_document::load_file(const char* path_, unsigned int options, xml_encoding encoding)
	{
		reset();

		using impl::auto_deleter; // MSVC7 workaround
		auto_deleter<FILE> file(impl::open_file(path_, "rb"), impl::close_file);

		return impl::load_file_impl(static_cast<impl::xml_document_struct*>(_root), file.data, options, encoding, &_buffer);
	}